

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::compute_hash_sampler(VkSamplerCreateInfo *sampler,Hash *out_hash)

{
  bool bVar1;
  Hasher h;
  Hasher local_10;
  
  local_10.h = ((((((((((((((((ulong)(sampler->flags & 0xfffffff7) ^ 0xaf63bd4c8601b7df) *
                             0x100000001b3 ^ (ulong)(uint)sampler->maxAnisotropy) * 0x100000001b3 ^
                           (ulong)(uint)sampler->mipLodBias) * 0x100000001b3 ^
                          (ulong)(uint)sampler->minLod) * 0x100000001b3 ^
                         (ulong)(uint)sampler->maxLod) * 0x100000001b3 ^ (ulong)sampler->minFilter)
                        * 0x100000001b3 ^ (ulong)sampler->magFilter) * 0x100000001b3 ^
                      (ulong)sampler->mipmapMode) * 0x100000001b3 ^ (ulong)sampler->compareEnable) *
                     0x100000001b3 ^ (ulong)sampler->compareOp) * 0x100000001b3 ^
                   (ulong)sampler->anisotropyEnable) * 0x100000001b3 ^ (ulong)sampler->addressModeU)
                  * 0x100000001b3 ^ (ulong)sampler->addressModeV) * 0x100000001b3 ^
                (ulong)sampler->addressModeW) * 0x100000001b3 ^ (ulong)sampler->borderColor) *
               0x100000001b3 ^ (ulong)sampler->unnormalizedCoordinates;
  bVar1 = hash_pnext_chain((StateRecorder *)0x0,&local_10,sampler->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar1) {
    *out_hash = local_10.h;
  }
  return bVar1;
}

Assistant:

bool compute_hash_sampler(const VkSamplerCreateInfo &sampler, Hash *out_hash)
{
	Hasher h;

	constexpr VkSamplerCreateFlagBits ignore_capture_replay_flags =
			VK_SAMPLER_CREATE_DESCRIPTOR_BUFFER_CAPTURE_REPLAY_BIT_EXT;

	h.u32(sampler.flags & ~ignore_capture_replay_flags);
	h.f32(sampler.maxAnisotropy);
	h.f32(sampler.mipLodBias);
	h.f32(sampler.minLod);
	h.f32(sampler.maxLod);
	h.u32(sampler.minFilter);
	h.u32(sampler.magFilter);
	h.u32(sampler.mipmapMode);
	h.u32(sampler.compareEnable);
	h.u32(sampler.compareOp);
	h.u32(sampler.anisotropyEnable);
	h.u32(sampler.addressModeU);
	h.u32(sampler.addressModeV);
	h.u32(sampler.addressModeW);
	h.u32(sampler.borderColor);
	h.u32(sampler.unnormalizedCoordinates);

	if (!hash_pnext_chain(nullptr, h, sampler.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}